

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O1

CharTypes Js::CharClassifier::GetBigCharTypeES5(codepoint_t codepoint,CharClassifier *instance)

{
  CharacterClassificationType CVar1;
  CharTypes CVar2;
  
  CVar2 = _C_ERR;
  if ((codepoint < 0x10000) && (CVar2 = _C_NWL, (codepoint & 0xfffe) != 0x2028)) {
    CVar1 = PlatformAgnostic::UnicodeText::GetLegacyCharacterClassificationType((char16)codepoint);
    CVar2 = _C_LET;
    if (CVar1 != Letter) {
      CVar2 = (uint)(CVar1 == Whitespace) * 4 + _C_ERR;
    }
  }
  return CVar2;
}

Assistant:

CharTypes Js::CharClassifier::GetBigCharTypeES5(codepoint_t codepoint, const Js::CharClassifier *instance)
{
    using namespace PlatformAgnostic::UnicodeText;

    if (codepoint > 0xFFFF)
    {
        return CharTypes::_C_ERR;
    }

    if (codepoint == kchLS || codepoint == kchPS)
    {
        return _C_NWL;
    }

    auto charType = GetLegacyCharacterClassificationType((char16)codepoint);
    if (charType == CharacterClassificationType::Letter)
    {
        return CharTypes::_C_LET;
    }
    else if (charType == CharacterClassificationType::Whitespace)
    {
        return CharTypes::_C_WSP;
    }

    return CharTypes::_C_ERR;
}